

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O3

void __thiscall
MeshDenoisingViaL0Minimization::solveDelta
          (MeshDenoisingViaL0Minimization *this,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *area_based_edge_operator,double lambda,double beta,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *delta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pointer pVVar4;
  pointer pVVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  value_type local_48;
  double local_28;
  double local_20;
  
  local_48.super_VectorDataT<double,_3>.values_[0] = 0.0;
  local_48.super_VectorDataT<double,_3>.values_[1] = 0.0;
  local_48.super_VectorDataT<double,_3>.values_[2] = 0.0;
  local_28 = lambda;
  local_20 = beta;
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (delta,(long)((int)((ulong)((long)(area_based_edge_operator->
                                              super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(area_based_edge_operator->
                                             super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                         -0x55555555),&local_48);
  pVVar4 = (area_based_edge_operator->
           super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pVVar5 = (area_based_edge_operator->
           super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pVVar5 - (long)pVVar4) >> 3) * -0x55555555) {
    lVar6 = 0x10;
    lVar7 = 0;
    do {
      dVar1 = *(double *)((long)(pVVar4->super_VectorDataT<double,_3>).values_ + lVar6 + -0x10);
      dVar2 = *(double *)((long)(pVVar4->super_VectorDataT<double,_3>).values_ + lVar6 + -8);
      dVar3 = *(double *)((long)(pVVar4->super_VectorDataT<double,_3>).values_ + lVar6);
      dVar8 = SQRT(dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2);
      if (local_28 / local_20 <= dVar8 * dVar8) {
        pVVar4 = (delta->
                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(double *)((long)(pVVar4->super_VectorDataT<double,_3>).values_ + lVar6 + -0x10) = dVar1;
        *(double *)((long)(pVVar4->super_VectorDataT<double,_3>).values_ + lVar6 + -8) = dVar2;
        *(double *)((long)(pVVar4->super_VectorDataT<double,_3>).values_ + lVar6) = dVar3;
        pVVar4 = (area_based_edge_operator->
                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pVVar5 = (area_based_edge_operator->
                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x18;
    } while (lVar7 < (int)((ulong)((long)pVVar5 - (long)pVVar4) >> 3) * -0x55555555);
  }
  return;
}

Assistant:

void MeshDenoisingViaL0Minimization::solveDelta(std::vector<TriMesh::Point> &area_based_edge_operator, double lambda, double beta,
                                                std::vector<TriMesh::Point> &delta)
{
    delta.resize((int)area_based_edge_operator.size(), TriMesh::Point(0.0, 0.0, 0.0));

    for(int i = 0; i < (int)area_based_edge_operator.size(); i++)
    {
        TriMesh::Point pt = area_based_edge_operator[i];
        if(pt.length() * pt.length() >= lambda/beta)
            delta[i] = pt;
    }
}